

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O3

void __thiscall
helics::CloningFilter::setString(CloningFilter *this,string_view property,string_view val)

{
  element_type *peVar1;
  int iVar2;
  long *__s1;
  size_t __n;
  char *__s2;
  size_type __rlen;
  
  __s1 = (long *)property._M_str;
  __n = property._M_len;
  switch(__n) {
  case 4:
    iVar2 = bcmp(__s1,"dest",__n);
    if (iVar2 != 0) goto switchD_0022002c_caseD_5;
    goto LAB_0022014a;
  default:
    goto switchD_0022002c_caseD_5;
  case 6:
    if (*(short *)((long)__s1 + 4) == 0x6563 && (int)*__s1 == 0x72756f73) {
LAB_0022010f:
      Interface::addSourceTarget((Interface *)this,val,UNKNOWN);
      return;
    }
    goto switchD_0022002c_caseD_5;
  case 8:
    iVar2 = bcmp(__s1,"add dest",__n);
    if (iVar2 == 0) goto LAB_0022014a;
    if (*__s1 != 0x746e696f70646e65) goto switchD_0022002c_caseD_5;
    goto LAB_00220097;
  case 10:
    iVar2 = bcmp(__s1,"add source",__n);
    if (iVar2 == 0) goto LAB_0022010f;
    goto switchD_0022002c_caseD_5;
  case 0xb:
    iVar2 = bcmp(__s1,"destination",__n);
    if (iVar2 == 0) goto LAB_0022014a;
    __s2 = "remove dest";
    break;
  case 0xc:
    iVar2 = bcmp(__s1,"add endpoint",__n);
    if (iVar2 != 0) goto switchD_0022002c_caseD_5;
LAB_00220097:
    Interface::addSourceTarget((Interface *)this,val,UNKNOWN);
LAB_0022014a:
    Interface::addDestinationTarget((Interface *)this,val,UNKNOWN);
    return;
  case 0xd:
    __s2 = "remove source";
    break;
  case 0xf:
    iVar2 = bcmp(__s1,"add destination",__n);
    if (iVar2 == 0) goto LAB_0022014a;
    __s2 = "remove endpoint";
    break;
  case 0x12:
    __s2 = "remove destination";
  }
  iVar2 = bcmp(__s1,__s2,__n);
  if (iVar2 == 0) {
    Interface::removeTarget((Interface *)this,val);
    return;
  }
switchD_0022002c_caseD_5:
  peVar1 = (this->super_Filter).filtOp.
           super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*peVar1->_vptr_FilterOperations[3])(peVar1,__n,__s1,val._M_len,val._M_str);
    return;
  }
  return;
}

Assistant:

void CloningFilter::setString(std::string_view property, std::string_view val)
{
    if ((property == "source") || (property == "add source")) {
        addSourceTarget(val);
    } else if (property == "dest" || property == "destination" || property == "add destination" ||
               property == "add dest") {
        addDestinationTarget(val);
    } else if (property == "endpoint" || property == "add endpoint") {
        addSourceTarget(val);
        addDestinationTarget(val);
    } else if (property == "remove destination" || property == "remove dest" ||
               property == "remove source" || property == "remove endpoint") {
        removeTarget(val);
    } else {
        Filter::setString(property, val);
    }
}